

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CWallet::chainStateFlushed(CWallet *this)

{
  long in_FS_OFFSET;
  CBlockLocator *in_stack_00000028;
  ChainstateRole in_stack_00000034;
  CWallet *in_stack_00000038;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    chainStateFlushed(in_stack_00000038,in_stack_00000034,in_stack_00000028);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::chainStateFlushed(ChainstateRole role, const CBlockLocator& loc)
{
    // Don't update the best block until the chain is attached so that in case of a shutdown,
    // the rescan will be restarted at next startup.
    if (m_attaching_chain || role == ChainstateRole::BACKGROUND) {
        return;
    }
    WalletBatch batch(GetDatabase());
    batch.WriteBestBlock(loc);
}